

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

socket_t __thiscall
UrsaClient::setup_connection::anon_class_8_1_8991fb9c::operator()(anon_class_8_1_8991fb9c *this)

{
  long lVar1;
  uint in_EAX;
  socklen_t in_ECX;
  sockaddr *__addr;
  void *extraout_RDX;
  long *in_RSI;
  socket_t sVar2;
  undefined8 local_18;
  
  lVar1 = *in_RSI;
  local_18._0_4_ = in_EAX;
  zmq::socket_t::socket_t((socket_t *)this,(context_t *)(lVar1 + 0x68),3);
  local_18 = (ulong)(uint)local_18;
  zmq::detail::socket_base::setsockopt<int>((socket_base *)this,0x11,(int *)((long)&local_18 + 4));
  local_18 = CONCAT44(local_18._4_4_,1000);
  zmq::detail::socket_base::setsockopt<int>((socket_base *)this,0x1b,(int *)&local_18);
  zmq::detail::socket_base::connect((socket_base *)this,(int)lVar1,__addr,in_ECX);
  sVar2.ctxptr = extraout_RDX;
  sVar2.super_socket_base._handle = this;
  return sVar2;
}

Assistant:

void UrsaClient::setup_connection() {
    auto make_socket = [this]() {
        zmq::socket_t socket(context, ZMQ_REQ);
        socket.setsockopt(ZMQ_LINGER, 0);
        socket.setsockopt(ZMQ_RCVTIMEO, 1000);
        socket.connect(server_addr);
        return socket;
    };

    if (is_interactive) {
        spdlog::info("Connecting to {}", server_addr);
    }
    cmd_socket = make_socket();
    check_conn_status(&cmd_socket);
    status_socket = make_socket();
}